

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Serialization_Test<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  reference pbVar4;
  char *pcVar5;
  reference lhs_expression;
  AssertionResult *this_00;
  char *expected_predicate_value;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  TypeParam ht_in;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  int i;
  TypeParam ht_out;
  key_type *in_stack_fffffffffffff848;
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff850;
  HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff858;
  hasher *in_stack_fffffffffffff860;
  char *in_stack_fffffffffffff868;
  int iVar6;
  HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff878;
  Type type;
  AssertHelper *in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff890;
  int iVar7;
  undefined6 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89e;
  undefined1 in_stack_fffffffffffff89f;
  Hasher *this_01;
  Hasher *this_02;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  *this_03;
  string local_728 [16];
  key_type *in_stack_fffffffffffff8e8;
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8f0;
  string local_6f8 [39];
  undefined1 local_6d1;
  AssertionResult local_6d0;
  string local_6c0 [48];
  string local_690 [24];
  value_type *in_stack_fffffffffffff988;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  AssertionResult local_668 [2];
  string local_648 [112];
  string local_5d8 [32];
  AssertionResult local_5b8;
  string local_5a8 [48];
  string local_578 [39];
  undefined1 local_551;
  AssertionResult local_550 [2];
  string local_530 [112];
  string local_4c0 [32];
  AssertionResult local_4a0 [2];
  string local_480 [112];
  string local_410 [32];
  AssertionResult local_3f0;
  string local_3e0 [55];
  undefined1 local_3a9;
  AssertionResult local_3a8;
  string local_398 [55];
  undefined1 local_361;
  AssertionResult local_360;
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_350;
  Hasher local_340;
  Hasher local_334;
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  local_328;
  string local_270 [55];
  undefined1 local_239;
  AssertionResult local_238;
  string local_228 [55];
  undefined1 local_1f1;
  AssertionResult local_1f0;
  FILE *local_1e0;
  string local_1d8 [32];
  string local_1b8 [120];
  string local_140 [36];
  int local_11c;
  string local_118 [48];
  Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
  local_e8;
  Hasher local_d8;
  Hasher local_cc;
  BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
  local_c0;
  
  bVar1 = google::
          HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 2));
  if (bVar1) {
    this_01 = &local_cc;
    Hasher::Hasher(this_01,0);
    this_02 = &local_d8;
    Hasher::Hasher(this_02,0);
    expected_predicate_value = (char *)0x0;
    this_03 = &local_e8;
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::Alloc(this_03,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff870,(size_type)in_stack_fffffffffffff868,
               in_stack_fffffffffffff860,(key_equal *)in_stack_fffffffffffff858,
               (allocator_type *)in_stack_fffffffffffff850);
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::~Alloc(&local_e8);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_fffffffffffff89f,
                            CONCAT16(in_stack_fffffffffffff89e,in_stack_fffffffffffff898)),
                (int)((ulong)in_stack_fffffffffffff890 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    std::__cxx11::string::~string(local_118);
    local_11c = 1;
    while( true ) {
      type = (Type)((ulong)in_stack_fffffffffffff878 >> 0x20);
      iVar7 = (int)((ulong)in_stack_fffffffffffff890 >> 0x20);
      if (99 < local_11c) break;
      HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueObject(in_stack_fffffffffffff858,(int)((ulong)in_stack_fffffffffffff850 >> 0x20));
      google::
      BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
               in_stack_fffffffffffff988);
      std::__cxx11::string::~string(local_140);
      local_11c = local_11c + 1;
    }
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_fffffffffffff89f,
                            CONCAT16(in_stack_fffffffffffff89e,in_stack_fffffffffffff898)),iVar7);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    std::__cxx11::string::~string(local_1b8);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(in_stack_fffffffffffff89f,
                            CONCAT16(in_stack_fffffffffffff89e,in_stack_fffffffffffff898)),iVar7);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    std::__cxx11::string::~string(local_1d8);
    local_1e0 = tmpfile();
    local_1f1 = local_1e0 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff850,(bool *)in_stack_fffffffffffff848,
               (type *)0xf379a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff880);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value
                );
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff880,type,(char *)in_stack_fffffffffffff870,
                 (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_228);
      testing::Message::~Message((Message *)0xf37ab7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf37b4b);
    uVar2 = google::
            BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>>
            ::serialize<ValueSerializer,_IO_FILE>(&local_c0,local_1e0);
    local_239 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff850,(bool *)in_stack_fffffffffffff848,
               (type *)0xf37b8c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff880);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value
                );
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff880,type,(char *)in_stack_fffffffffffff870,
                 (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_270);
      testing::Message::~Message((Message *)0xf37c61);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf37cf8);
    rewind(local_1e0);
    Hasher::Hasher(&local_334,0);
    Hasher::Hasher(&local_340,0);
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::Alloc(&local_350,0,(int *)0x0);
    google::
    HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_SparseHashSet
              (in_stack_fffffffffffff870,(size_type)in_stack_fffffffffffff868,
               in_stack_fffffffffffff860,(key_equal *)in_stack_fffffffffffff858,
               (allocator_type *)in_stack_fffffffffffff850);
    Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>
    ::~Alloc(&local_350);
    local_361 = local_1e0 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff850,(bool *)in_stack_fffffffffffff848,
               (type *)0xf37da0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff880);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value
                );
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff880,type,(char *)in_stack_fffffffffffff870,
                 (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_398);
      testing::Message::~Message((Message *)0xf37eb4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf37f48);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::string,Hasher,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>>
            ::unserialize<ValueSerializer,_IO_FILE>(&local_328,local_1e0);
    local_3a9 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff850,(bool *)in_stack_fffffffffffff848,
               (type *)0xf37f89);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff880);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value
                );
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff880,type,(char *)in_stack_fffffffffffff870,
                 (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_3e0);
      testing::Message::~Message((Message *)0xf3805e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf380f5);
    fclose(local_1e0);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffff858,(int)((ulong)in_stack_fffffffffffff850 >> 0x20));
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff898)),iVar7);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    pbVar4 = google::
             sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             ::operator*((sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                          *)0xf38168);
    iVar7 = (int)((ulong)pbVar4 >> 0x20);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff858,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff850);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string(local_410);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff880);
      testing::AssertionResult::failure_message((AssertionResult *)0xf38242);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff880,type,(char *)in_stack_fffffffffffff870,
                 (int)((ulong)in_stack_fffffffffffff868 >> 0x20),(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      testing::Message::~Message((Message *)0xf3829f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf38310);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffff858,(int)((ulong)in_stack_fffffffffffff850 >> 0x20));
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff898)),iVar7);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    pbVar4 = google::
             sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             ::operator*((sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                          *)0xf38374);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              (in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff858,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff850);
    iVar6 = (int)((ulong)in_stack_fffffffffffff868 >> 0x20);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::string::~string(local_4c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4a0);
    if (!bVar1) {
      testing::Message::Message((Message *)pbVar4);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0xf3844e);
      type = (Type)((ulong)pcVar5 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pbVar4,type,(char *)in_stack_fffffffffffff870,iVar6,
                 (char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      testing::Message::~Message((Message *)0xf384ab);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf3851c);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff898)),iVar7);
    pcVar5 = (char *)google::
                     BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                     ::count(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    local_551 = pcVar5 == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff850,(bool *)in_stack_fffffffffffff848,
               (type *)0xf3857d);
    std::__cxx11::string::~string(local_578);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
    if (!bVar1) {
      testing::Message::Message((Message *)pbVar4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value
                );
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pbVar4,type,pcVar5,iVar6,(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_5a8);
      testing::Message::~Message((Message *)0xf38685);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf3871c);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueObject(in_stack_fffffffffffff858,(int)((ulong)in_stack_fffffffffffff850 >> 0x20));
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff898)),iVar7);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    lhs_expression =
         google::
         sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
         ::operator*((sparse_hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                      *)0xf38780);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((char *)lhs_expression,(char *)in_stack_fffffffffffff860,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff858,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff850);
    iVar6 = (int)((ulong)lhs_expression >> 0x20);
    std::__cxx11::string::~string(local_648);
    std::__cxx11::string::~string(local_5d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b8);
    if (!bVar1) {
      testing::Message::Message((Message *)pbVar4);
      in_stack_fffffffffffff860 =
           (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0xf3885a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pbVar4,type,pcVar5,iVar6,(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      testing::Message::~Message((Message *)0xf388b7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf38928);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff898)),iVar7);
    google::
    BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::count(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff850,(bool *)in_stack_fffffffffffff848,
               (type *)0xf38989);
    std::__cxx11::string::~string(local_690);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_668);
    if (!bVar1) {
      testing::Message::Message((Message *)pbVar4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value
                );
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pbVar4,type,pcVar5,iVar6,(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff850);
      std::__cxx11::string::~string(local_6c0);
      testing::Message::~Message((Message *)0xf38a91);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf38b28);
    HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff898)),iVar7);
    this_00 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::sparse_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    local_6d1 = this_00 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_00,(bool *)in_stack_fffffffffffff848,(type *)0xf38b89);
    std::__cxx11::string::~string(local_6f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6d0);
    if (!bVar1) {
      testing::Message::Message((Message *)pbVar4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)this_03,(char *)this_02,(char *)this_01,expected_predicate_value
                );
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pbVar4,type,pcVar5,iVar6,(char *)in_stack_fffffffffffff860);
      testing::internal::AssertHelper::operator=(in_RDI,(Message *)this_03);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      std::__cxx11::string::~string(local_728);
      testing::Message::~Message((Message *)0xf38c91);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf38d25);
    google::
    HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)0xf38d32);
    google::
    HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_SparseHashSet
              ((HashtableInterface_SparseHashSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)0xf38d3f);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Serialization) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.serialize(ValueSerializer(), fp));
  rewind(fp);

  TypeParam ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.unserialize(ValueSerializer(), fp));
  fclose(fp);

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}